

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrapred_ssse3.c
# Opt level: O0

void aom_smooth_h_predictor_16x4_ssse3
               (uint8_t *dst,ptrdiff_t stride,uint8_t *top_row,uint8_t *left_column)

{
  byte bVar1;
  undefined4 uVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined8 *puVar6;
  undefined4 *in_RCX;
  long in_RDX;
  long in_RSI;
  undefined8 *in_RDI;
  short sVar7;
  ushort uVar8;
  ushort uVar9;
  ushort uVar10;
  ushort uVar11;
  ushort uVar12;
  short sVar14;
  short sVar15;
  ushort uVar16;
  ushort uVar17;
  ushort uVar18;
  ushort uVar19;
  short sVar20;
  short sVar21;
  ushort uVar22;
  ushort uVar23;
  ushort uVar24;
  ushort uVar25;
  short sVar26;
  short sVar27;
  ushort uVar28;
  ushort uVar29;
  ushort uVar30;
  ushort uVar31;
  short sVar32;
  short sVar33;
  ushort uVar34;
  ushort uVar35;
  ushort uVar36;
  ushort uVar37;
  short sVar38;
  short sVar39;
  ushort uVar40;
  ushort uVar41;
  ushort uVar42;
  ushort uVar43;
  short sVar44;
  short sVar45;
  ushort uVar46;
  ushort uVar47;
  ushort uVar48;
  ushort uVar49;
  short sVar50;
  short sVar51;
  undefined1 auVar13 [16];
  ushort uVar52;
  ushort uVar53;
  ushort uVar54;
  ushort uVar55;
  __m128i weights1;
  __m128i scale;
  __m128i weights;
  __m128i left;
  __m128i top_right;
  int val;
  __m128i pred2_3;
  __m128i pred1_3;
  __m128i pred_sum2_3;
  __m128i pred_sum1_3;
  __m128i weighted_px2_3;
  __m128i weighted_px1_3;
  __m128i pred2_2;
  __m128i pred1_2;
  __m128i pred_sum2_2;
  __m128i pred_sum1_2;
  __m128i weighted_px2_2;
  __m128i weighted_px1_2;
  __m128i pred2_1;
  __m128i pred1_1;
  __m128i pred_sum2_1;
  __m128i pred_sum1_1;
  __m128i weighted_px2_1;
  __m128i weighted_px1_1;
  __m128i pred2;
  __m128i pred1;
  __m128i pred_sum2;
  __m128i pred_sum1;
  __m128i weighted_px2;
  __m128i weighted_px1;
  byte local_ac8;
  undefined1 uStack_ac7;
  undefined1 uStack_ac6;
  undefined1 uStack_ac5;
  ushort uStack_a42;
  ushort uStack_a3a;
  ushort uStack_a26;
  ushort uStack_a24;
  ushort uStack_a22;
  ushort uStack_a1e;
  ushort uStack_a1c;
  ushort uStack_a1a;
  short local_838;
  short sStack_836;
  short sStack_834;
  short sStack_832;
  short sStack_830;
  short sStack_82e;
  short sStack_82c;
  short sStack_82a;
  short local_678;
  short sStack_676;
  short sStack_674;
  short sStack_672;
  short sStack_670;
  short sStack_66e;
  short sStack_66c;
  short sStack_66a;
  short local_4b8;
  short sStack_4b6;
  short sStack_4b4;
  short sStack_4b2;
  short sStack_4b0;
  short sStack_4ae;
  short sStack_4ac;
  short sStack_4aa;
  short local_2f8;
  short sStack_2f6;
  short sStack_2f4;
  short sStack_2f2;
  short sStack_2f0;
  short sStack_2ee;
  short sStack_2ec;
  short sStack_2ea;
  __m128i left_y;
  __m128i y_mask;
  __m128i round;
  __m128i scaled_top_right2;
  __m128i scaled_top_right1;
  __m128i inverted_weights2;
  __m128i inverted_weights1;
  __m128i weights2;
  
  bVar1 = *(byte *)(in_RDX + 0xf);
  uVar12 = (ushort)bVar1;
  uVar2 = *in_RCX;
  local_ac8 = (byte)uVar2;
  uStack_ac7 = (undefined1)((uint)uVar2 >> 8);
  uStack_ac6 = (undefined1)((uint)uVar2 >> 0x10);
  uStack_ac5 = (undefined1)((uint)uVar2 >> 0x18);
  uStack_a26 = (ushort)bVar1;
  uStack_a24 = (ushort)bVar1;
  uStack_a22 = (ushort)bVar1;
  uStack_a1e = (ushort)bVar1;
  uStack_a1c = (ushort)bVar1;
  uStack_a1a = (ushort)bVar1;
  sVar14 = uStack_a26 * 0x1f;
  sVar20 = uStack_a24 * 0x3c;
  sVar26 = uStack_a22 * 0x56;
  sVar32 = uVar12 * 0x6f;
  sVar38 = uStack_a1e * 0x85;
  sVar44 = uStack_a1c * 0x9a;
  sVar50 = uStack_a1a * 0xac;
  uStack_a42 = (ushort)bVar1;
  uStack_a3a = (ushort)bVar1;
  sVar7 = uVar12 * 0xbc;
  sVar15 = uStack_a26 * 0xca;
  sVar21 = uStack_a24 * 0xd5;
  sVar27 = uStack_a42 * 0xdf;
  sVar33 = uVar12 * 0xe6;
  sVar39 = uStack_a1e * 0xec;
  sVar45 = uStack_a1c * 0xef;
  sVar51 = uStack_a3a * 0xf0;
  auVar5._8_8_ = 0x100010001000100;
  auVar5._0_8_ = 0x100010001000100;
  auVar13 = pshufb(ZEXT716(CONCAT16(uStack_ac5,
                                    (uint6)CONCAT14(uStack_ac6,
                                                    (uint)CONCAT12(uStack_ac7,(ushort)local_ac8)))),
                   auVar5);
  local_2f8 = auVar13._0_2_;
  sStack_2f6 = auVar13._2_2_;
  sStack_2f4 = auVar13._4_2_;
  sStack_2f2 = auVar13._6_2_;
  sStack_2f0 = auVar13._8_2_;
  sStack_2ee = auVar13._10_2_;
  sStack_2ec = auVar13._12_2_;
  sStack_2ea = auVar13._14_2_;
  uVar8 = uVar12 + local_2f8 * 0xff + 0x80;
  uVar16 = sVar14 + sStack_2f6 * 0xe1 + 0x80;
  uVar22 = sVar20 + sStack_2f4 * 0xc4 + 0x80;
  uVar28 = sVar26 + sStack_2f2 * 0xaa + 0x80;
  uVar34 = sVar32 + sStack_2f0 * 0x91 + 0x80;
  uVar40 = sVar38 + sStack_2ee * 0x7b + 0x80;
  uVar46 = sVar44 + sStack_2ec * 0x66 + 0x80;
  uVar52 = sVar50 + sStack_2ea * 0x54 + 0x80;
  uVar9 = uVar8 >> 8;
  uVar17 = uVar16 >> 8;
  uVar23 = uVar22 >> 8;
  uVar29 = uVar28 >> 8;
  uVar35 = uVar34 >> 8;
  uVar41 = uVar40 >> 8;
  uVar47 = uVar46 >> 8;
  uVar53 = uVar52 >> 8;
  uVar10 = sVar7 + local_2f8 * 0x44 + 0x80;
  uVar18 = sVar15 + sStack_2f6 * 0x36 + 0x80;
  uVar24 = sVar21 + sStack_2f4 * 0x2b + 0x80;
  uVar30 = sVar27 + sStack_2f2 * 0x21 + 0x80;
  uVar36 = sVar33 + sStack_2f0 * 0x1a + 0x80;
  uVar42 = sVar39 + sStack_2ee * 0x14 + 0x80;
  uVar48 = sVar45 + sStack_2ec * 0x11 + 0x80;
  uVar54 = sVar51 + sStack_2ea * 0x10 + 0x80;
  uVar11 = uVar10 >> 8;
  uVar19 = uVar18 >> 8;
  uVar25 = uVar24 >> 8;
  uVar31 = uVar30 >> 8;
  uVar37 = uVar36 >> 8;
  uVar43 = uVar42 >> 8;
  uVar49 = uVar48 >> 8;
  uVar55 = uVar54 >> 8;
  *in_RDI = CONCAT17((uVar53 != 0) * (uVar53 < 0x100) * (char)(uVar52 >> 8) - (0xff < uVar53),
                     CONCAT16((uVar47 != 0) * (uVar47 < 0x100) * (char)(uVar46 >> 8) -
                              (0xff < uVar47),
                              CONCAT15((uVar41 != 0) * (uVar41 < 0x100) * (char)(uVar40 >> 8) -
                                       (0xff < uVar41),
                                       CONCAT14((uVar35 != 0) * (uVar35 < 0x100) *
                                                (char)(uVar34 >> 8) - (0xff < uVar35),
                                                CONCAT13((uVar29 != 0) * (uVar29 < 0x100) *
                                                         (char)(uVar28 >> 8) - (0xff < uVar29),
                                                         CONCAT12((uVar23 != 0) * (uVar23 < 0x100) *
                                                                  (char)(uVar22 >> 8) -
                                                                  (0xff < uVar23),
                                                                  CONCAT11((uVar17 != 0) *
                                                                           (uVar17 < 0x100) *
                                                                           (char)(uVar16 >> 8) -
                                                                           (0xff < uVar17),
                                                                           (uVar9 != 0) *
                                                                           (uVar9 < 0x100) *
                                                                           (char)(uVar8 >> 8) -
                                                                           (0xff < uVar9))))))));
  in_RDI[1] = CONCAT17((uVar55 != 0) * (uVar55 < 0x100) * (char)(uVar54 >> 8) - (0xff < uVar55),
                       CONCAT16((uVar49 != 0) * (uVar49 < 0x100) * (char)(uVar48 >> 8) -
                                (0xff < uVar49),
                                CONCAT15((uVar43 != 0) * (uVar43 < 0x100) * (char)(uVar42 >> 8) -
                                         (0xff < uVar43),
                                         CONCAT14((uVar37 != 0) * (uVar37 < 0x100) *
                                                  (char)(uVar36 >> 8) - (0xff < uVar37),
                                                  CONCAT13((uVar31 != 0) * (uVar31 < 0x100) *
                                                           (char)(uVar30 >> 8) - (0xff < uVar31),
                                                           CONCAT12((uVar25 != 0) * (uVar25 < 0x100)
                                                                    * (char)(uVar24 >> 8) -
                                                                    (0xff < uVar25),
                                                                    CONCAT11((uVar19 != 0) *
                                                                             (uVar19 < 0x100) *
                                                                             (char)(uVar18 >> 8) -
                                                                             (0xff < uVar19),
                                                                             (uVar11 != 0) *
                                                                             (uVar11 < 0x100) *
                                                                             (char)(uVar10 >> 8) -
                                                                             (0xff < uVar11))))))));
  puVar6 = (undefined8 *)((long)in_RDI + in_RSI);
  auVar4._8_8_ = 0x302030203020302;
  auVar4._0_8_ = 0x302030203020302;
  auVar13 = pshufb(ZEXT716(CONCAT16(uStack_ac5,
                                    (uint6)CONCAT14(uStack_ac6,
                                                    (uint)CONCAT12(uStack_ac7,(ushort)local_ac8)))),
                   auVar4);
  local_4b8 = auVar13._0_2_;
  sStack_4b6 = auVar13._2_2_;
  sStack_4b4 = auVar13._4_2_;
  sStack_4b2 = auVar13._6_2_;
  sStack_4b0 = auVar13._8_2_;
  sStack_4ae = auVar13._10_2_;
  sStack_4ac = auVar13._12_2_;
  sStack_4aa = auVar13._14_2_;
  uVar8 = uVar12 + local_4b8 * 0xff + 0x80;
  uVar16 = sVar14 + sStack_4b6 * 0xe1 + 0x80;
  uVar22 = sVar20 + sStack_4b4 * 0xc4 + 0x80;
  uVar28 = sVar26 + sStack_4b2 * 0xaa + 0x80;
  uVar34 = sVar32 + sStack_4b0 * 0x91 + 0x80;
  uVar40 = sVar38 + sStack_4ae * 0x7b + 0x80;
  uVar46 = sVar44 + sStack_4ac * 0x66 + 0x80;
  uVar52 = sVar50 + sStack_4aa * 0x54 + 0x80;
  uVar9 = uVar8 >> 8;
  uVar17 = uVar16 >> 8;
  uVar23 = uVar22 >> 8;
  uVar29 = uVar28 >> 8;
  uVar35 = uVar34 >> 8;
  uVar41 = uVar40 >> 8;
  uVar47 = uVar46 >> 8;
  uVar53 = uVar52 >> 8;
  uVar10 = sVar7 + local_4b8 * 0x44 + 0x80;
  uVar18 = sVar15 + sStack_4b6 * 0x36 + 0x80;
  uVar24 = sVar21 + sStack_4b4 * 0x2b + 0x80;
  uVar30 = sVar27 + sStack_4b2 * 0x21 + 0x80;
  uVar36 = sVar33 + sStack_4b0 * 0x1a + 0x80;
  uVar42 = sVar39 + sStack_4ae * 0x14 + 0x80;
  uVar48 = sVar45 + sStack_4ac * 0x11 + 0x80;
  uVar54 = sVar51 + sStack_4aa * 0x10 + 0x80;
  uVar11 = uVar10 >> 8;
  uVar19 = uVar18 >> 8;
  uVar25 = uVar24 >> 8;
  uVar31 = uVar30 >> 8;
  uVar37 = uVar36 >> 8;
  uVar43 = uVar42 >> 8;
  uVar49 = uVar48 >> 8;
  uVar55 = uVar54 >> 8;
  *puVar6 = CONCAT17((uVar53 != 0) * (uVar53 < 0x100) * (char)(uVar52 >> 8) - (0xff < uVar53),
                     CONCAT16((uVar47 != 0) * (uVar47 < 0x100) * (char)(uVar46 >> 8) -
                              (0xff < uVar47),
                              CONCAT15((uVar41 != 0) * (uVar41 < 0x100) * (char)(uVar40 >> 8) -
                                       (0xff < uVar41),
                                       CONCAT14((uVar35 != 0) * (uVar35 < 0x100) *
                                                (char)(uVar34 >> 8) - (0xff < uVar35),
                                                CONCAT13((uVar29 != 0) * (uVar29 < 0x100) *
                                                         (char)(uVar28 >> 8) - (0xff < uVar29),
                                                         CONCAT12((uVar23 != 0) * (uVar23 < 0x100) *
                                                                  (char)(uVar22 >> 8) -
                                                                  (0xff < uVar23),
                                                                  CONCAT11((uVar17 != 0) *
                                                                           (uVar17 < 0x100) *
                                                                           (char)(uVar16 >> 8) -
                                                                           (0xff < uVar17),
                                                                           (uVar9 != 0) *
                                                                           (uVar9 < 0x100) *
                                                                           (char)(uVar8 >> 8) -
                                                                           (0xff < uVar9))))))));
  puVar6[1] = CONCAT17((uVar55 != 0) * (uVar55 < 0x100) * (char)(uVar54 >> 8) - (0xff < uVar55),
                       CONCAT16((uVar49 != 0) * (uVar49 < 0x100) * (char)(uVar48 >> 8) -
                                (0xff < uVar49),
                                CONCAT15((uVar43 != 0) * (uVar43 < 0x100) * (char)(uVar42 >> 8) -
                                         (0xff < uVar43),
                                         CONCAT14((uVar37 != 0) * (uVar37 < 0x100) *
                                                  (char)(uVar36 >> 8) - (0xff < uVar37),
                                                  CONCAT13((uVar31 != 0) * (uVar31 < 0x100) *
                                                           (char)(uVar30 >> 8) - (0xff < uVar31),
                                                           CONCAT12((uVar25 != 0) * (uVar25 < 0x100)
                                                                    * (char)(uVar24 >> 8) -
                                                                    (0xff < uVar25),
                                                                    CONCAT11((uVar19 != 0) *
                                                                             (uVar19 < 0x100) *
                                                                             (char)(uVar18 >> 8) -
                                                                             (0xff < uVar19),
                                                                             (uVar11 != 0) *
                                                                             (uVar11 < 0x100) *
                                                                             (char)(uVar10 >> 8) -
                                                                             (0xff < uVar11))))))));
  puVar6 = (undefined8 *)((long)puVar6 + in_RSI);
  auVar3._8_8_ = 0x504050405040504;
  auVar3._0_8_ = 0x504050405040504;
  auVar13 = pshufb(ZEXT716(CONCAT16(uStack_ac5,
                                    (uint6)CONCAT14(uStack_ac6,
                                                    (uint)CONCAT12(uStack_ac7,(ushort)local_ac8)))),
                   auVar3);
  local_678 = auVar13._0_2_;
  sStack_676 = auVar13._2_2_;
  sStack_674 = auVar13._4_2_;
  sStack_672 = auVar13._6_2_;
  sStack_670 = auVar13._8_2_;
  sStack_66e = auVar13._10_2_;
  sStack_66c = auVar13._12_2_;
  sStack_66a = auVar13._14_2_;
  uVar8 = uVar12 + local_678 * 0xff + 0x80;
  uVar16 = sVar14 + sStack_676 * 0xe1 + 0x80;
  uVar22 = sVar20 + sStack_674 * 0xc4 + 0x80;
  uVar28 = sVar26 + sStack_672 * 0xaa + 0x80;
  uVar34 = sVar32 + sStack_670 * 0x91 + 0x80;
  uVar40 = sVar38 + sStack_66e * 0x7b + 0x80;
  uVar46 = sVar44 + sStack_66c * 0x66 + 0x80;
  uVar52 = sVar50 + sStack_66a * 0x54 + 0x80;
  uVar9 = uVar8 >> 8;
  uVar17 = uVar16 >> 8;
  uVar23 = uVar22 >> 8;
  uVar29 = uVar28 >> 8;
  uVar35 = uVar34 >> 8;
  uVar41 = uVar40 >> 8;
  uVar47 = uVar46 >> 8;
  uVar53 = uVar52 >> 8;
  uVar10 = sVar7 + local_678 * 0x44 + 0x80;
  uVar18 = sVar15 + sStack_676 * 0x36 + 0x80;
  uVar24 = sVar21 + sStack_674 * 0x2b + 0x80;
  uVar30 = sVar27 + sStack_672 * 0x21 + 0x80;
  uVar36 = sVar33 + sStack_670 * 0x1a + 0x80;
  uVar42 = sVar39 + sStack_66e * 0x14 + 0x80;
  uVar48 = sVar45 + sStack_66c * 0x11 + 0x80;
  uVar54 = sVar51 + sStack_66a * 0x10 + 0x80;
  uVar11 = uVar10 >> 8;
  uVar19 = uVar18 >> 8;
  uVar25 = uVar24 >> 8;
  uVar31 = uVar30 >> 8;
  uVar37 = uVar36 >> 8;
  uVar43 = uVar42 >> 8;
  uVar49 = uVar48 >> 8;
  uVar55 = uVar54 >> 8;
  *puVar6 = CONCAT17((uVar53 != 0) * (uVar53 < 0x100) * (char)(uVar52 >> 8) - (0xff < uVar53),
                     CONCAT16((uVar47 != 0) * (uVar47 < 0x100) * (char)(uVar46 >> 8) -
                              (0xff < uVar47),
                              CONCAT15((uVar41 != 0) * (uVar41 < 0x100) * (char)(uVar40 >> 8) -
                                       (0xff < uVar41),
                                       CONCAT14((uVar35 != 0) * (uVar35 < 0x100) *
                                                (char)(uVar34 >> 8) - (0xff < uVar35),
                                                CONCAT13((uVar29 != 0) * (uVar29 < 0x100) *
                                                         (char)(uVar28 >> 8) - (0xff < uVar29),
                                                         CONCAT12((uVar23 != 0) * (uVar23 < 0x100) *
                                                                  (char)(uVar22 >> 8) -
                                                                  (0xff < uVar23),
                                                                  CONCAT11((uVar17 != 0) *
                                                                           (uVar17 < 0x100) *
                                                                           (char)(uVar16 >> 8) -
                                                                           (0xff < uVar17),
                                                                           (uVar9 != 0) *
                                                                           (uVar9 < 0x100) *
                                                                           (char)(uVar8 >> 8) -
                                                                           (0xff < uVar9))))))));
  puVar6[1] = CONCAT17((uVar55 != 0) * (uVar55 < 0x100) * (char)(uVar54 >> 8) - (0xff < uVar55),
                       CONCAT16((uVar49 != 0) * (uVar49 < 0x100) * (char)(uVar48 >> 8) -
                                (0xff < uVar49),
                                CONCAT15((uVar43 != 0) * (uVar43 < 0x100) * (char)(uVar42 >> 8) -
                                         (0xff < uVar43),
                                         CONCAT14((uVar37 != 0) * (uVar37 < 0x100) *
                                                  (char)(uVar36 >> 8) - (0xff < uVar37),
                                                  CONCAT13((uVar31 != 0) * (uVar31 < 0x100) *
                                                           (char)(uVar30 >> 8) - (0xff < uVar31),
                                                           CONCAT12((uVar25 != 0) * (uVar25 < 0x100)
                                                                    * (char)(uVar24 >> 8) -
                                                                    (0xff < uVar25),
                                                                    CONCAT11((uVar19 != 0) *
                                                                             (uVar19 < 0x100) *
                                                                             (char)(uVar18 >> 8) -
                                                                             (0xff < uVar19),
                                                                             (uVar11 != 0) *
                                                                             (uVar11 < 0x100) *
                                                                             (char)(uVar10 >> 8) -
                                                                             (0xff < uVar11))))))));
  auVar13._8_8_ = 0x706070607060706;
  auVar13._0_8_ = 0x706070607060706;
  auVar13 = pshufb(ZEXT716(CONCAT16(uStack_ac5,
                                    (uint6)CONCAT14(uStack_ac6,
                                                    (uint)CONCAT12(uStack_ac7,(ushort)local_ac8)))),
                   auVar13);
  local_838 = auVar13._0_2_;
  sStack_836 = auVar13._2_2_;
  sStack_834 = auVar13._4_2_;
  sStack_832 = auVar13._6_2_;
  sStack_830 = auVar13._8_2_;
  sStack_82e = auVar13._10_2_;
  sStack_82c = auVar13._12_2_;
  sStack_82a = auVar13._14_2_;
  uVar12 = uVar12 + local_838 * 0xff + 0x80;
  uVar11 = sVar14 + sStack_836 * 0xe1 + 0x80;
  uVar19 = sVar20 + sStack_834 * 0xc4 + 0x80;
  uVar25 = sVar26 + sStack_832 * 0xaa + 0x80;
  uVar31 = sVar32 + sStack_830 * 0x91 + 0x80;
  uVar37 = sVar38 + sStack_82e * 0x7b + 0x80;
  uVar43 = sVar44 + sStack_82c * 0x66 + 0x80;
  uVar49 = sVar50 + sStack_82a * 0x54 + 0x80;
  uVar8 = uVar12 >> 8;
  uVar16 = uVar11 >> 8;
  uVar22 = uVar19 >> 8;
  uVar28 = uVar25 >> 8;
  uVar34 = uVar31 >> 8;
  uVar40 = uVar37 >> 8;
  uVar46 = uVar43 >> 8;
  uVar52 = uVar49 >> 8;
  uVar9 = sVar7 + local_838 * 0x44 + 0x80;
  uVar17 = sVar15 + sStack_836 * 0x36 + 0x80;
  uVar23 = sVar21 + sStack_834 * 0x2b + 0x80;
  uVar29 = sVar27 + sStack_832 * 0x21 + 0x80;
  uVar35 = sVar33 + sStack_830 * 0x1a + 0x80;
  uVar41 = sVar39 + sStack_82e * 0x14 + 0x80;
  uVar47 = sVar45 + sStack_82c * 0x11 + 0x80;
  uVar53 = sVar51 + sStack_82a * 0x10 + 0x80;
  uVar10 = uVar9 >> 8;
  uVar18 = uVar17 >> 8;
  uVar24 = uVar23 >> 8;
  uVar30 = uVar29 >> 8;
  uVar36 = uVar35 >> 8;
  uVar42 = uVar41 >> 8;
  uVar48 = uVar47 >> 8;
  uVar54 = uVar53 >> 8;
  *(undefined8 *)((long)puVar6 + in_RSI) =
       CONCAT17((uVar52 != 0) * (uVar52 < 0x100) * (char)(uVar49 >> 8) - (0xff < uVar52),
                CONCAT16((uVar46 != 0) * (uVar46 < 0x100) * (char)(uVar43 >> 8) - (0xff < uVar46),
                         CONCAT15((uVar40 != 0) * (uVar40 < 0x100) * (char)(uVar37 >> 8) -
                                  (0xff < uVar40),
                                  CONCAT14((uVar34 != 0) * (uVar34 < 0x100) * (char)(uVar31 >> 8) -
                                           (0xff < uVar34),
                                           CONCAT13((uVar28 != 0) * (uVar28 < 0x100) *
                                                    (char)(uVar25 >> 8) - (0xff < uVar28),
                                                    CONCAT12((uVar22 != 0) * (uVar22 < 0x100) *
                                                             (char)(uVar19 >> 8) - (0xff < uVar22),
                                                             CONCAT11((uVar16 != 0) *
                                                                      (uVar16 < 0x100) *
                                                                      (char)(uVar11 >> 8) -
                                                                      (0xff < uVar16),
                                                                      (uVar8 != 0) * (uVar8 < 0x100)
                                                                      * (char)(uVar12 >> 8) -
                                                                      (0xff < uVar8))))))));
  ((undefined8 *)((long)puVar6 + in_RSI))[1] =
       CONCAT17((uVar54 != 0) * (uVar54 < 0x100) * (char)(uVar53 >> 8) - (0xff < uVar54),
                CONCAT16((uVar48 != 0) * (uVar48 < 0x100) * (char)(uVar47 >> 8) - (0xff < uVar48),
                         CONCAT15((uVar42 != 0) * (uVar42 < 0x100) * (char)(uVar41 >> 8) -
                                  (0xff < uVar42),
                                  CONCAT14((uVar36 != 0) * (uVar36 < 0x100) * (char)(uVar35 >> 8) -
                                           (0xff < uVar36),
                                           CONCAT13((uVar30 != 0) * (uVar30 < 0x100) *
                                                    (char)(uVar29 >> 8) - (0xff < uVar30),
                                                    CONCAT12((uVar24 != 0) * (uVar24 < 0x100) *
                                                             (char)(uVar23 >> 8) - (0xff < uVar24),
                                                             CONCAT11((uVar18 != 0) *
                                                                      (uVar18 < 0x100) *
                                                                      (char)(uVar17 >> 8) -
                                                                      (0xff < uVar18),
                                                                      (uVar10 != 0) *
                                                                      (uVar10 < 0x100) *
                                                                      (char)(uVar9 >> 8) -
                                                                      (0xff < uVar10))))))));
  return;
}

Assistant:

void aom_smooth_h_predictor_16x4_ssse3(
    uint8_t *LIBAOM_RESTRICT dst, ptrdiff_t stride,
    const uint8_t *LIBAOM_RESTRICT top_row,
    const uint8_t *LIBAOM_RESTRICT left_column) {
  const __m128i top_right = _mm_set1_epi16(top_row[15]);
  const __m128i left = cvtepu8_epi16(Load4(left_column));
  const __m128i weights = LoadUnaligned16(smooth_weights + 12);
  const __m128i scale = _mm_set1_epi16(1 << SMOOTH_WEIGHT_LOG2_SCALE);
  const __m128i weights1 = cvtepu8_epi16(weights);
  const __m128i weights2 = cvtepu8_epi16(_mm_srli_si128(weights, 8));
  const __m128i inverted_weights1 = _mm_sub_epi16(scale, weights1);
  const __m128i inverted_weights2 = _mm_sub_epi16(scale, weights2);
  const __m128i scaled_top_right1 =
      _mm_mullo_epi16(inverted_weights1, top_right);
  const __m128i scaled_top_right2 =
      _mm_mullo_epi16(inverted_weights2, top_right);
  const __m128i round = _mm_set1_epi16(1 << (SMOOTH_WEIGHT_LOG2_SCALE - 1));
  __m128i y_mask = _mm_set1_epi32(0x01000100);
  __m128i left_y = _mm_shuffle_epi8(left, y_mask);
  write_smooth_directional_sum16(dst, left_y, left_y, weights1, weights2,
                                 scaled_top_right1, scaled_top_right2, round);
  dst += stride;
  y_mask = _mm_set1_epi32(0x03020302);
  left_y = _mm_shuffle_epi8(left, y_mask);
  write_smooth_directional_sum16(dst, left_y, left_y, weights1, weights2,
                                 scaled_top_right1, scaled_top_right2, round);
  dst += stride;
  y_mask = _mm_set1_epi32(0x05040504);
  left_y = _mm_shuffle_epi8(left, y_mask);
  write_smooth_directional_sum16(dst, left_y, left_y, weights1, weights2,
                                 scaled_top_right1, scaled_top_right2, round);
  dst += stride;
  y_mask = _mm_set1_epi32(0x07060706);
  left_y = _mm_shuffle_epi8(left, y_mask);
  write_smooth_directional_sum16(dst, left_y, left_y, weights1, weights2,
                                 scaled_top_right1, scaled_top_right2, round);
}